

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

int NGA_Create_irreg(int type,int ndim,int *dims,char *name,int *block,int *map)

{
  Integer *__ptr;
  logical lVar1;
  long in_RDX;
  int in_ESI;
  long in_R8;
  int i_1;
  int i;
  Integer *_ga_map_capi;
  Integer _ga_work [7];
  Integer _ga_dims [7];
  logical st;
  Integer g_a;
  int local_c8;
  int local_c4;
  int *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff4c;
  int *in_stack_ffffffffffffff50;
  Integer *in_stack_ffffffffffffff88;
  Integer *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  Integer *in_stack_ffffffffffffffa0;
  Integer in_stack_ffffffffffffffa8;
  Integer in_stack_ffffffffffffffb0;
  Integer *in_stack_ffffffffffffffc0;
  int local_38;
  int local_4;
  
  if (in_ESI < 8) {
    for (local_c4 = 0; local_c4 < in_ESI; local_c4 = local_c4 + 1) {
      *(long *)(&stack0xffffffffffffff88 + (long)((in_ESI - local_c4) + -1) * 8) =
           (long)*(int *)(in_RDX + (long)local_c4 * 4);
    }
    for (local_c8 = 0; local_c8 < in_ESI; local_c8 = local_c8 + 1) {
      *(long *)(&stack0xffffffffffffff48 + (long)((in_ESI - local_c8) + -1) * 8) =
           (long)*(int *)(in_R8 + (long)local_c8 * 4);
    }
    __ptr = copy_map(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40);
    _ga_irreg_flag = 1;
    lVar1 = pnga_create_irreg(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                              in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                              in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                              in_stack_ffffffffffffffc0);
    _ga_irreg_flag = 0;
    free(__ptr);
    if (lVar1 == 1) {
      local_4 = local_38;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int NGA_Create_irreg(int type,int ndim,int dims[],char *name,int block[],int map[])
{
    Integer g_a;
    logical st;
    Integer _ga_dims[MAXDIM];
    Integer _ga_work[MAXDIM];
    Integer *_ga_map_capi;
    if(ndim>MAXDIM)return 0;

    COPYC2F(dims,_ga_dims, ndim);
    COPYC2F(block,_ga_work, ndim);
    _ga_map_capi = copy_map(block, ndim, map);

    _ga_irreg_flag = 1; /* set this flag=1, to indicate array is irregular */
    st = wnga_create_irreg(type, (Integer)ndim, _ga_dims, name, _ga_map_capi,
            _ga_work, &g_a);
    _ga_irreg_flag = 0; /* unset it after creating the array */

    free(_ga_map_capi);
    if(st==TRUE) return (int) g_a;
    else return 0;
}